

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O0

void transpose_16bit_16x16_avx2(__m256i *in,__m256i *out)

{
  __m256i t [16];
  __m256i *in_stack_ffffffffffffffe8;
  __m256i *in_stack_fffffffffffffff0;
  
  transpose2_8x8_avx2(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  transpose2_8x8_avx2(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static inline void transpose_16bit_16x16_avx2(const __m256i *const in,
                                              __m256i *const out) {
  __m256i t[16];

#define LOADL(idx)                                                            \
  t[idx] = _mm256_castsi128_si256(_mm_load_si128((__m128i const *)&in[idx])); \
  t[idx] = _mm256_inserti128_si256(                                           \
      t[idx], _mm_load_si128((__m128i const *)&in[idx + 8]), 1);

#define LOADR(idx)                                                           \
  t[8 + idx] =                                                               \
      _mm256_castsi128_si256(_mm_load_si128((__m128i const *)&in[idx] + 1)); \
  t[8 + idx] = _mm256_inserti128_si256(                                      \
      t[8 + idx], _mm_load_si128((__m128i const *)&in[idx + 8] + 1), 1);

  // load left 8x16
  LOADL(0)
  LOADL(1)
  LOADL(2)
  LOADL(3)
  LOADL(4)
  LOADL(5)
  LOADL(6)
  LOADL(7)

  // load right 8x16
  LOADR(0)
  LOADR(1)
  LOADR(2)
  LOADR(3)
  LOADR(4)
  LOADR(5)
  LOADR(6)
  LOADR(7)

  // get the top 16x8 result
  transpose2_8x8_avx2(t, out);
  // get the bottom 16x8 result
  transpose2_8x8_avx2(&t[8], &out[8]);
}